

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

void __thiscall mkvmuxer::Tag::Clear(Tag *this)

{
  int iVar1;
  SimpleTag *st;
  Tag *this_local;
  
  while (0 < this->simple_tags_count_) {
    iVar1 = this->simple_tags_count_ + -1;
    this->simple_tags_count_ = iVar1;
    SimpleTag::Clear(this->simple_tags_ + iVar1);
  }
  if (this->simple_tags_ != (SimpleTag *)0x0) {
    operator_delete__(this->simple_tags_);
  }
  this->simple_tags_ = (SimpleTag *)0x0;
  this->simple_tags_size_ = 0;
  return;
}

Assistant:

void Tag::Clear() {
  while (simple_tags_count_ > 0) {
    SimpleTag& st = simple_tags_[--simple_tags_count_];
    st.Clear();
  }

  delete[] simple_tags_;
  simple_tags_ = NULL;

  simple_tags_size_ = 0;
}